

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertBitsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,unsigned_long mask,
          size_t byteCount,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  undefined8 in_stack_00000018;
  UtestShell *in_stack_fffffffffffffee8;
  SimpleString *in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  UtestShell *in_stack_ffffffffffffff58;
  BitsEqualFailure *in_stack_ffffffffffffff60;
  undefined1 local_98 [8];
  unsigned_long in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  
  pTVar1 = getTestResult(in_stack_fffffffffffffee8);
  (*pTVar1->_vptr_TestResult[10])();
  if ((in_RSI & in_RCX) != (in_RDX & in_RCX)) {
    SimpleString::SimpleString(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    BitsEqualFailure::BitsEqualFailure
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(unsigned_long)in_RDI,in_RDX,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_98,in_stack_00000018);
    BitsEqualFailure::~BitsEqualFailure((BitsEqualFailure *)0x188d3d);
    SimpleString::~SimpleString((SimpleString *)0x188d47);
  }
  return;
}

Assistant:

void UtestShell::assertBitsEqual(unsigned long expected, unsigned long actual, unsigned long mask, size_t byteCount, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if ((expected & mask) != (actual & mask))
        failWith(BitsEqualFailure(this, fileName, lineNumber, expected, actual, mask, byteCount, text), testTerminator);
}